

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O3

int cuddResizeTableZdd(DdManager *unique,int index)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  DdSubtable *pDVar3;
  int *piVar4;
  int *piVar5;
  undefined8 uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  void *__s;
  DdSubtable *pDVar11;
  int *piVar12;
  int *piVar13;
  DdNode **ppDVar14;
  uint uVar15;
  ulong uVar16;
  size_t sVar17;
  long lVar18;
  uint *puVar19;
  long lVar20;
  
  iVar7 = unique->maxSizeZ;
  uVar15 = unique->initSlots;
  uVar8 = unique->sizeZ;
  lVar10 = (long)(int)uVar8;
  if (index < iVar7) {
    if ((int)uVar8 <= index) {
      sVar17 = (ulong)uVar15 * 8;
      pDVar11 = unique->subtableZ;
      lVar18 = lVar10 * 0x38;
      lVar20 = 0;
      do {
        *(uint *)((long)&pDVar11->slots + lVar18) = uVar15;
        iVar7 = cuddComputeFloorLog2(uVar15);
        pDVar11 = unique->subtableZ;
        *(int *)((long)&pDVar11->shift + lVar18) = 0x20 - iVar7;
        *(undefined4 *)((long)&pDVar11->keys + lVar18) = 0;
        *(uint *)((long)&pDVar11->maxKeys + lVar18) = uVar15 * 4;
        *(undefined4 *)((long)&pDVar11->dead + lVar18) = 0;
        iVar7 = uVar8 + (int)lVar20;
        unique->permZ[lVar10 + lVar20] = iVar7;
        unique->invpermZ[lVar10 + lVar20] = iVar7;
        __s = malloc(sVar17);
        *(void **)((long)&pDVar11->nodelist + lVar18) = __s;
        if (__s == (void *)0x0) goto LAB_00811a26;
        if (uVar15 != 0) {
          memset(__s,0,sVar17);
        }
        lVar20 = lVar20 + 1;
        lVar18 = lVar18 + 0x38;
      } while (uVar8 + ~index + (int)lVar20 != 0);
    }
LAB_00811979:
    uVar8 = ((index + 1) - unique->sizeZ) * uVar15 + unique->slots;
    unique->slots = uVar8;
    unique->minDead = (uint)(long)((double)uVar8 * unique->gcFrac);
    uVar15 = unique->maxCacheHard;
    if (uVar8 * 4 < unique->maxCacheHard) {
      uVar15 = uVar8 * 4;
    }
    iVar7 = uVar15 + unique->cacheSlots * -2;
    unique->cacheSlack = iVar7;
    if (-1 < iVar7 && unique->cacheSlots < uVar8 >> 1) {
      cuddCacheResize(unique);
    }
    unique->sizeZ = index + 1;
    iVar7 = unique->autoDynZ;
    unique->autoDynZ = 0;
    cuddZddFreeUniv(unique);
    iVar9 = cuddZddInitUniv(unique);
    uVar15 = (uint)(iVar9 != 0);
    unique->autoDynZ = iVar7;
  }
  else {
    iVar9 = index + 10;
    pDVar11 = (DdSubtable *)malloc((long)iVar9 * 0x38);
    if (pDVar11 != (DdSubtable *)0x0) {
      sVar17 = (long)iVar9 << 2;
      piVar12 = (int *)malloc(sVar17);
      if ((piVar12 != (int *)0x0) && (piVar13 = (int *)malloc(sVar17), piVar13 != (int *)0x0)) {
        unique->memused = unique->memused + ((ulong)(uVar15 + 1) * 8 + 0x40) * (long)(iVar9 - iVar7)
        ;
        if (unique->maxSize < iVar9) {
          if (unique->stack != (DdNode **)0x0) {
            free(unique->stack);
          }
          ppDVar14 = (DdNode **)malloc((long)index * 8 + 0x58);
          unique->stack = ppDVar14;
          if (ppDVar14 == (DdNode **)0x0) goto LAB_00811a26;
          *ppDVar14 = (DdNode *)0x0;
          iVar7 = unique->maxSize;
          if (unique->maxSize < unique->maxSizeZ) {
            iVar7 = unique->maxSizeZ;
          }
          unique->memused = unique->memused + (long)(iVar9 - iVar7) * 8;
        }
        if (0 < (int)uVar8) {
          pDVar3 = unique->subtableZ;
          piVar4 = unique->permZ;
          piVar5 = unique->invpermZ;
          lVar10 = 6;
          uVar16 = 0;
          do {
            puVar1 = (undefined8 *)((long)pDVar3 + lVar10 * 4 + -0x10);
            uVar6 = puVar1[1];
            puVar2 = (undefined8 *)((long)pDVar11 + lVar10 * 4 + -0x10);
            *puVar2 = *puVar1;
            puVar2[1] = uVar6;
            *(undefined4 *)((long)&pDVar11->nodelist + lVar10 * 4) =
                 *(undefined4 *)((long)&pDVar3->nodelist + lVar10 * 4);
            *(undefined8 *)((long)pDVar11 + lVar10 * 4 + -0x18) =
                 *(undefined8 *)((long)pDVar3 + lVar10 * 4 + -0x18);
            piVar12[uVar16] = piVar4[uVar16];
            piVar13[uVar16] = piVar5[uVar16];
            uVar16 = uVar16 + 1;
            lVar10 = lVar10 + 0xe;
          } while (uVar8 != uVar16);
        }
        if ((int)uVar8 <= index) {
          sVar17 = (ulong)uVar15 * 8;
          puVar19 = &pDVar11[(int)uVar8].dead;
          lVar10 = 0;
          do {
            puVar19[-3] = uVar15;
            iVar7 = cuddComputeFloorLog2(uVar15);
            puVar19[-4] = 0x20 - iVar7;
            puVar19[-2] = 0;
            puVar19[-1] = uVar15 * 4;
            *puVar19 = 0;
            iVar7 = uVar8 + (int)lVar10;
            piVar12[(int)uVar8 + lVar10] = iVar7;
            piVar13[(int)uVar8 + lVar10] = iVar7;
            ppDVar14 = (DdNode **)malloc(sVar17);
            ((DdSubtable *)(puVar19 + -6))->nodelist = ppDVar14;
            if (ppDVar14 == (DdNode **)0x0) goto LAB_00811a26;
            if (uVar15 != 0) {
              memset(ppDVar14,0,sVar17);
            }
            lVar10 = lVar10 + 1;
            puVar19 = puVar19 + 0xe;
          } while (~index + uVar8 + (int)lVar10 != 0);
        }
        if (unique->subtableZ != (DdSubtable *)0x0) {
          free(unique->subtableZ);
        }
        unique->subtableZ = pDVar11;
        unique->maxSizeZ = iVar9;
        if (unique->permZ != (int *)0x0) {
          free(unique->permZ);
        }
        unique->permZ = piVar12;
        if (unique->invpermZ != (int *)0x0) {
          free(unique->invpermZ);
        }
        unique->invpermZ = piVar13;
        goto LAB_00811979;
      }
    }
LAB_00811a26:
    unique->errorCode = CUDD_MEMORY_OUT;
    uVar15 = 0;
  }
  return uVar15;
}

Assistant:

int
cuddResizeTableZdd(
  DdManager * unique,
  int  index)
{
    DdSubtable *newsubtables;
    DdNodePtr *newnodelist;
    int oldsize,newsize;
    int i,j,reorderSave;
    unsigned int numSlots = unique->initSlots;
    int *newperm, *newinvperm;

    oldsize = unique->sizeZ;
    /* Easy case: there is still room in the current table. */
    if (index < unique->maxSizeZ) {
        for (i = oldsize; i <= index; i++) {
            unique->subtableZ[i].slots = numSlots;
            unique->subtableZ[i].shift = sizeof(int) * 8 -
                cuddComputeFloorLog2(numSlots);
            unique->subtableZ[i].keys = 0;
            unique->subtableZ[i].maxKeys = numSlots * DD_MAX_SUBTABLE_DENSITY;
            unique->subtableZ[i].dead = 0;
            unique->permZ[i] = i;
            unique->invpermZ[i] = i;
            newnodelist = unique->subtableZ[i].nodelist =
                ABC_ALLOC(DdNodePtr, numSlots);
            if (newnodelist == NULL) {
                unique->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            for (j = 0; (unsigned) j < numSlots; j++) {
                newnodelist[j] = NULL;
            }
        }
    } else {
        /* The current table is too small: we need to allocate a new,
        ** larger one; move all old subtables, and initialize the new
        ** subtables up to index included.
        */
        newsize = index + DD_DEFAULT_RESIZE;
#ifdef DD_VERBOSE
        (void) fprintf(unique->err,
                       "Increasing the ZDD table size from %d to %d\n",
            unique->maxSizeZ, newsize);
#endif
        newsubtables = ABC_ALLOC(DdSubtable,newsize);
        if (newsubtables == NULL) {
            unique->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        newperm = ABC_ALLOC(int,newsize);
        if (newperm == NULL) {
            unique->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        newinvperm = ABC_ALLOC(int,newsize);
        if (newinvperm == NULL) {
            unique->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        unique->memused += (newsize - unique->maxSizeZ) * ((numSlots+1) *
            sizeof(DdNode *) + 2 * sizeof(int) + sizeof(DdSubtable));
        if (newsize > unique->maxSize) {
            ABC_FREE(unique->stack);
            unique->stack = ABC_ALLOC(DdNodePtr,newsize + 1);
            if (unique->stack == NULL) {
                unique->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            unique->stack[0] = NULL; /* to suppress harmless UMR */
            unique->memused +=
                (newsize - ddMax(unique->maxSize,unique->maxSizeZ))
                * sizeof(DdNode *);
        }
        for (i = 0; i < oldsize; i++) {
            newsubtables[i].slots = unique->subtableZ[i].slots;
            newsubtables[i].shift = unique->subtableZ[i].shift;
            newsubtables[i].keys = unique->subtableZ[i].keys;
            newsubtables[i].maxKeys = unique->subtableZ[i].maxKeys;
            newsubtables[i].dead = unique->subtableZ[i].dead;
            newsubtables[i].nodelist = unique->subtableZ[i].nodelist;
            newperm[i] = unique->permZ[i];
            newinvperm[i] = unique->invpermZ[i];
        }
        for (i = oldsize; i <= index; i++) {
            newsubtables[i].slots = numSlots;
            newsubtables[i].shift = sizeof(int) * 8 -
                cuddComputeFloorLog2(numSlots);
            newsubtables[i].keys = 0;
            newsubtables[i].maxKeys = numSlots * DD_MAX_SUBTABLE_DENSITY;
            newsubtables[i].dead = 0;
            newperm[i] = i;
            newinvperm[i] = i;
            newnodelist = newsubtables[i].nodelist = ABC_ALLOC(DdNodePtr, numSlots);
            if (newnodelist == NULL) {
                unique->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            for (j = 0; (unsigned) j < numSlots; j++) {
                newnodelist[j] = NULL;
            }
        }
        ABC_FREE(unique->subtableZ);
        unique->subtableZ = newsubtables;
        unique->maxSizeZ = newsize;
        ABC_FREE(unique->permZ);
        unique->permZ = newperm;
        ABC_FREE(unique->invpermZ);
        unique->invpermZ = newinvperm;
    }
    unique->slots += (index + 1 - unique->sizeZ) * numSlots;
    ddFixLimits(unique);
    unique->sizeZ = index + 1;

    /* Now that the table is in a coherent state, update the ZDD
    ** universe. We need to temporarily disable reordering,
    ** because we cannot reorder without universe in place.
    */

    reorderSave = unique->autoDynZ;
    unique->autoDynZ = 0;
    cuddZddFreeUniv(unique);
    if (!cuddZddInitUniv(unique)) {
        unique->autoDynZ = reorderSave;
        return(0);
    }
    unique->autoDynZ = reorderSave;

    return(1);

}